

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O0

bool Cipher::mutateClusters(TParameters *params,TClusters *clusters)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  int idx;
  int i;
  int n;
  undefined4 local_18;
  
  sVar4 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  for (local_18 = 0; local_18 < 1; local_18 = local_18 + 1) {
    iVar2 = rand();
    iVar3 = rand();
    iVar1 = *(int *)(in_RDI + 4);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(iVar2 % (int)sVar4));
    *pvVar5 = iVar3 % iVar1;
  }
  return true;
}

Assistant:

bool mutateClusters(const TParameters & params, TClusters & clusters) {
        int n = clusters.size();

        //for (int i = 0; i < 3; ++i) {
        //    int i0 = rand()%n;
        //    int i1 = rand()%n;
        //    std::swap(clusters[i0], clusters[i1]);
        //}

        for (int i = 0; i < 1; ++i) {
            int idx = rand()%n;
            clusters[idx] = rand()%params.maxClusters;
            //auto p = clusters[idx];
            //while (clusters[idx] == p) {
            //    clusters[idx] = rand()%params.maxClusters;
            //}
        }

        //std::map<int, bool> used;
        //for (int i = 0; i < n; ++i) {
        //    if (hint[i] < 0) continue;
        //    clusters[i] = hint[i];
        //    used[hint[i]] = true;
        //}

        return true;
    }